

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrixEigenExtensions.h
# Opt level: O2

void __thiscall
Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::ArchiveOUT
          (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *this,ChArchiveOut *marchive)

{
  ChStreamOutAscii *this_00;
  ChArchiveAsciiDump *this_01;
  Scalar *pSVar1;
  int j;
  long lVar2;
  int i;
  long lVar3;
  double *foo;
  size_t m_col;
  size_t m_row;
  ChValueSpecific<double_*> specVal;
  char idname [21];
  ChNameValue<double> local_e0;
  double *local_c8;
  unsigned_long local_c0;
  unsigned_long local_b8;
  ChValueSpecific<double_*> local_b0;
  char local_78 [24];
  ChNameValue<unsigned_long> local_60;
  ChNameValue<unsigned_long> local_48;
  
  chrono::ChArchiveOut::VersionWrite<chrono::ChMatrix_dense_version_tag>(marchive);
  this_01 = (ChArchiveAsciiDump *)
            __dynamic_cast(marchive,&chrono::ChArchiveOut::typeinfo,
                           &chrono::ChArchiveAsciiDump::typeinfo,0);
  if (this_01 == (ChArchiveAsciiDump *)0x0) {
    local_b8 = *(unsigned_long *)(this + 8);
    local_48._value = &local_b8;
    local_c0 = *(unsigned_long *)(this + 0x10);
    local_48._name = "rows";
    local_48._flags = '\0';
    chrono::ChArchiveOut::operator<<(marchive,&local_48);
    local_60._name = "columns";
    local_60._flags = '\0';
    local_60._value = &local_c0;
    chrono::ChArchiveOut::operator<<(marchive,&local_60);
    lVar2 = *(long *)(this + 0x10) * *(long *)(this + 8);
    local_c8 = (double *)0x0;
    chrono::ChValueSpecific<double_*>::ChValueSpecific(&local_b0,&local_c8,"data",'\0');
    (*(marchive->super_ChArchive)._vptr_ChArchive[0xe])(marchive,&local_b0,lVar2);
    for (lVar3 = 0; lVar2 - lVar3 != 0; lVar3 = lVar3 + 1) {
      sprintf(local_78,"%lu",lVar3);
      local_e0._value =
           DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this,lVar3);
      local_e0._flags = '\0';
      local_e0._name = local_78;
      chrono::ChArchiveOut::operator<<(marchive,&local_e0);
      (*(marchive->super_ChArchive)._vptr_ChArchive[0xf])(marchive,&local_b0,lVar2);
    }
    (*(marchive->super_ChArchive)._vptr_ChArchive[0x10])(marchive,&local_b0,lVar2);
    chrono::ChValue::~ChValue(&local_b0.super_ChValue);
  }
  else {
    chrono::ChArchiveAsciiDump::indent(this_01);
    chrono::ChStreamOutAscii::operator<<(this_01->ostream,*(int *)(this + 8));
    chrono::ChStreamOutAscii::operator<<(this_01->ostream," rows,  ");
    chrono::ChStreamOutAscii::operator<<(this_01->ostream,*(int *)(this + 0x10));
    chrono::ChStreamOutAscii::operator<<(this_01->ostream," columns:\n");
    for (lVar3 = 0; lVar3 < *(long *)(this + 8); lVar3 = lVar3 + 1) {
      chrono::ChArchiveAsciiDump::indent(this_01);
      for (lVar2 = 0; this_00 = this_01->ostream, lVar2 < *(long *)(this + 0x10); lVar2 = lVar2 + 1)
      {
        pSVar1 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this,
                            lVar3,lVar2);
        chrono::ChStreamOutAscii::operator<<(this_00,*pSVar1);
        chrono::ChStreamOutAscii::operator<<(this_01->ostream,", ");
      }
      chrono::ChStreamOutAscii::operator<<(this_00,"\n");
    }
  }
  return;
}

Assistant:

void ArchiveOUT(chrono::ChArchiveOut& marchive) {
    // suggested: use versioning
	marchive.VersionWrite<chrono::ChMatrix_dense_version_tag>(); // btw use the ChMatrixDynamic version tag also for all other templates.

    // stream out all member data

    if (chrono::ChArchiveAsciiDump* mascii = dynamic_cast<chrono::ChArchiveAsciiDump*>(&marchive)) {
        // CUSTOM row x col 'intuitive' table-like log when using ChArchiveAsciiDump:
        mascii->indent();
        mascii->GetStream()->operator<<((int)derived().rows());
        mascii->GetStream()->operator<<(" rows,  ");
        mascii->GetStream()->operator<<((int)derived().cols());
        mascii->GetStream()->operator<<(" columns:\n");
        for (int i = 0; i < derived().rows(); i++) {
            mascii->indent();
            for (int j = 0; j < derived().cols(); j++) {
                (*mascii->GetStream()) << derived()(i, j);
                mascii->GetStream()->operator<<(", ");
            }
            mascii->GetStream()->operator<<("\n");
        }
    } else {
        size_t m_row = derived().rows();
		size_t m_col = derived().cols();
        marchive << chrono::make_ChNameValue("rows", m_row);
        marchive << chrono::make_ChNameValue("columns", m_col);
         
        // NORMAL array-based serialization:
        size_t tot_elements = derived().rows() *  derived().cols();
		double* foo = 0;
        chrono::ChValueSpecific< double* > specVal(foo, "data", 0);
        marchive.out_array_pre(specVal, tot_elements);
		char idname[21]; // only for xml, xml serialization needs unique element name
        for (size_t i = 0; i < tot_elements; i++) {
			sprintf(idname, "%lu", (unsigned long)i);
            marchive << chrono::CHNVP(derived()((Eigen::Index)i), idname);
            marchive.out_array_between(specVal, tot_elements);
        }
        marchive.out_array_end(specVal, tot_elements);
    }
}